

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O0

FT_Error ft_svg_property_get(FT_Module module,char *property_name,void *value)

{
  int iVar1;
  SVG_RendererHooks *hooks;
  SVG_Renderer renderer;
  FT_Error error;
  void *value_local;
  char *property_name_local;
  FT_Module module_local;
  
  renderer._4_4_ = 0;
  iVar1 = strcmp(property_name,"svg-hooks");
  if (iVar1 == 0) {
    *(FT_Memory *)value = module[5].memory;
    *(FT_Module_Class **)((long)value + 8) = module[6].clazz;
    *(FT_Library *)((long)value + 0x10) = module[6].library;
    *(FT_Memory *)((long)value + 0x18) = module[6].memory;
  }
  else {
    renderer._4_4_ = 0xc;
  }
  return renderer._4_4_;
}

Assistant:

static FT_Error
  ft_svg_property_get( FT_Module    module,
                       const char*  property_name,
                       const void*  value )
  {
    FT_Error      error    = FT_Err_Ok;
    SVG_Renderer  renderer = (SVG_Renderer)module;


    if ( !ft_strcmp( property_name, "svg-hooks" ) )
    {
      SVG_RendererHooks*  hooks = (SVG_RendererHooks*)value;


      *hooks = renderer->hooks;
    }
    else
      error = FT_THROW( Missing_Property );

    return error;
  }